

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

IntegerVectorExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IntegerVectorExpressionSyntax,slang::syntax::IntegerVectorExpressionSyntax_const&>
          (BumpAllocator *this,IntegerVectorExpressionSyntax *args)

{
  undefined4 uVar1;
  IntegerVectorExpressionSyntax *pIVar2;
  long lVar3;
  IntegerVectorExpressionSyntax *pIVar4;
  byte bVar5;
  
  bVar5 = 0;
  pIVar2 = (IntegerVectorExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((IntegerVectorExpressionSyntax *)this->endPtr < pIVar2 + 1) {
    pIVar2 = (IntegerVectorExpressionSyntax *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(pIVar2 + 1);
  }
  pIVar4 = pIVar2;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)
             &(args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.
              field_0x4;
    (pIVar4->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
         (args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
    *(undefined4 *)
     &(pIVar4->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4 =
         uVar1;
    args = (IntegerVectorExpressionSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pIVar4 = (IntegerVectorExpressionSyntax *)((long)pIVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pIVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }